

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O1

int CfdAddMultisigScriptData(void *handle,void *multisig_handle,char *pubkey)

{
  pointer pcVar1;
  size_t sVar2;
  CfdException *pCVar3;
  string pubkey_str;
  Pubkey key;
  undefined1 local_68 [32];
  Pubkey local_48;
  
  cfd::Initialize();
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"MultisigScript","");
  cfd::capi::CheckBuffer(multisig_handle,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  if (pubkey != (char *)0x0) {
    if (*(uint *)((long)multisig_handle + 0xa54) < 0x14) {
      local_68._0_8_ = pcVar1;
      sVar2 = strlen(pubkey);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,pubkey,pubkey + sVar2);
      cfd::core::Pubkey::Pubkey(&local_48,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_);
      }
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_68,&local_48);
      std::__cxx11::string::copy
                (local_68,(long)multisig_handle +
                          (ulong)*(uint *)((long)multisig_handle + 0xa54) * 0x83 + 0x18,0x82);
      *(int *)((long)multisig_handle + 0xa54) = *(int *)((long)multisig_handle + 0xa54) + 1;
      if ((pointer)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_);
      }
      if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_68._0_8_ = "cfdcapi_address.cpp";
    local_68._8_4_ = 0x111;
    local_68._16_8_ = "CfdAddMultisigScriptData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_68,kCfdLogLevelWarning,
               "The number of pubkey has reached the upper limit.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"The number of pubkey has reached the upper limit.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)local_68);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_68._0_8_ = "cfdcapi_address.cpp";
  local_68._8_4_ = 0x107;
  local_68._16_8_ = "CfdAddMultisigScriptData";
  cfd::core::logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"pubkey is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Failed to parameter. pubkey is null.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddMultisigScriptData(
    void* handle, void* multisig_handle, const char* pubkey) {
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScript);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }

    CfdCapiMultisigScript* data =
        static_cast<CfdCapiMultisigScript*>(multisig_handle);
    if (data->current_index >= kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE, "The number of pubkey has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of pubkey has reached the upper limit.");
    }

    Pubkey key = Pubkey(std::string(pubkey));
    std::string pubkey_str = key.GetHex();
    pubkey_str.copy(data->pubkeys[data->current_index], kPubkeyHexSize);
    ++(data->current_index);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}